

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_proxy_preventExtensions(JSContext *ctx,JSValue obj)

{
  JSValueUnion JVar1;
  int iVar2;
  uint uVar3;
  JSValueUnion *argv;
  JSValue obj_00;
  JSValue JVar4;
  JSValue method;
  
  argv = (JSValueUnion *)get_proxy_method(ctx,&method,obj,0x62);
  if (argv != (JSValueUnion *)0x0) {
    if ((int)method.tag == 3) {
      iVar2 = JS_PreventExtensions(ctx,*(JSValue *)argv);
      return iVar2;
    }
    JVar4.tag = method.tag;
    JVar4.u.float64 = method.u.float64;
    JVar4 = JS_CallFree(ctx,JVar4,*(JSValue *)(argv + 2),1,(JSValue *)argv);
    if ((int)JVar4.tag != 6) {
      iVar2 = JS_ToBoolFree(ctx,JVar4);
      if (iVar2 == 0) {
        return 0;
      }
      if (argv[1].int32 != -1) {
        return iVar2;
      }
      JVar1 = (JSValueUnion)argv->ptr;
      if (*(short *)((long)JVar1.ptr + 6) == 0x29) {
        obj_00.tag = (int64_t)argv[1].ptr;
        obj_00.u = (JSValueUnion)(JSValueUnion)JVar1.ptr;
        uVar3 = js_proxy_isExtensible(ctx,obj_00);
        if ((int)uVar3 < 0) {
          return -1;
        }
      }
      else {
        uVar3 = *(byte *)((long)JVar1.ptr + 5) & 1;
      }
      if (uVar3 == 0) {
        return iVar2;
      }
      JS_ThrowTypeError(ctx,"proxy: inconsistent preventExtensions");
    }
  }
  return -1;
}

Assistant:

static int js_proxy_preventExtensions(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret;
    BOOL res;
    int res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_preventExtensions);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_PreventExtensions(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    if (res) {
        res2 = JS_IsExtensible(ctx, s->target);
        if (res2 < 0)
            return res2;
        if (res2) {
            JS_ThrowTypeError(ctx, "proxy: inconsistent preventExtensions");
            return -1;
        }
    }
    return res;
}